

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFGGrindReader.cpp
# Opt level: O0

void __thiscall CFGGrindReader::loadCFGs(CFGGrindReader *this)

{
  int iVar1;
  Type TVar2;
  bool bVar3;
  Type TVar4;
  int iVar5;
  CFG *pCVar6;
  BlockData *this_00;
  Addr AVar7;
  CfgNode *pCVar8;
  unsigned_long_long count_00;
  Instruction *instr_00;
  CFG *pCVar9;
  reference ppCVar10;
  CFG *cfg_2;
  iterator __end1;
  iterator __begin1;
  set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *__range1;
  unsigned_long_long count_2;
  Addr saddr_1;
  CfgNode *dst;
  bool indirect;
  CFG *handler;
  unsigned_long_long count_1;
  Addr saddr;
  int sigid;
  CFG *call;
  unsigned_long_long count;
  Addr caddr;
  Instruction *instr;
  Addr AStack_b8;
  int size;
  Addr iaddr;
  int bsize;
  CfgNode *entry;
  BlockData *data;
  CfgNode *node;
  Addr baddr;
  CFG *cfg_1;
  Addr faddr;
  CFG *cfg;
  string fname;
  unsigned_long_long local_50;
  unsigned_long_long execs;
  Addr addr;
  string local_30 [8];
  string keyword;
  CFGGrindReader *this_local;
  
  do {
    if ((this->m_current).type != TKN_BRACKET_OPEN) {
      matchToken(this,TKN_EOF);
      CFGReader::cfgs((set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *)&__begin1,
                      &this->super_CFGReader);
      __end1 = std::set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_>::begin
                         ((set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *)&__begin1);
      cfg_2 = (CFG *)std::set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_>::end
                               ((set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *)&__begin1);
      while (bVar3 = std::operator!=(&__end1,(_Self *)&cfg_2), bVar3) {
        ppCVar10 = std::_Rb_tree_const_iterator<CFG_*>::operator*(&__end1);
        CFG::check(*ppCVar10);
        std::_Rb_tree_const_iterator<CFG_*>::operator++(&__end1);
      }
      std::set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_>::~set
                ((set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *)&__begin1);
      return;
    }
    matchToken(this,TKN_BRACKET_OPEN);
    std::__cxx11::string::string(local_30,(string *)&(this->m_current).token);
    matchToken(this,TKN_KEYWORD);
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_30,"cfg");
    if (bVar3) {
      AVar7 = (this->m_current).data.addr;
      matchToken(this,TKN_ADDR);
      local_50 = 0;
      if ((this->m_current).type == TKN_COLON) {
        matchToken(this,TKN_COLON);
        local_50 = (this->m_current).data.number;
        matchToken(this,TKN_NUMBER);
      }
      std::__cxx11::string::string((string *)&cfg,(string *)&(this->m_current).token);
      matchToken(this,TKN_STRING);
      matchToken(this,TKN_BOOL);
      pCVar6 = CFGReader::instance(&this->super_CFGReader,AVar7);
      CFG::setFunctionName(pCVar6,(string *)&cfg);
      CFG::updateExecs(pCVar6,local_50);
      std::__cxx11::string::~string((string *)&cfg);
    }
    else {
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_30,"node");
      if (!bVar3) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFGGrindReader.cpp"
                      ,0xc3,"virtual void CFGGrindReader::loadCFGs()");
      }
      AVar7 = (this->m_current).data.addr;
      matchToken(this,TKN_ADDR);
      pCVar6 = CFGReader::instance(&this->super_CFGReader,AVar7);
      AStack_b8 = (this->m_current).data.addr;
      matchToken(this,TKN_ADDR);
      data = (BlockData *)CFG::nodeByAddr(pCVar6,AStack_b8);
      this_00 = (BlockData *)operator_new(0x90);
      CfgNode::BlockData::BlockData(this_00,AStack_b8,0,false);
      if (data == (BlockData *)0x0) {
        data = (BlockData *)operator_new(0x18);
        CfgNode::CfgNode((CfgNode *)data,CFG_BLOCK);
        CfgNode::setData((CfgNode *)data,(Data *)this_00);
        CFG::addNode(pCVar6,(CfgNode *)data);
      }
      else {
        TVar4 = CfgNode::type((CfgNode *)data);
        if (TVar4 != CFG_PHANTOM) {
          __assert_fail("node->type() == CfgNode::CFG_PHANTOM",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFGGrindReader.cpp"
                        ,0x4e,"virtual void CFGGrindReader::loadCFGs()");
        }
        CfgNode::setData((CfgNode *)data,(Data *)this_00);
      }
      AVar7 = CFG::addr(pCVar6);
      if (AStack_b8 == AVar7) {
        pCVar8 = CFG::entryNode(pCVar6);
        if (pCVar8 != (CfgNode *)0x0) {
          __assert_fail("cfg->entryNode() == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFGGrindReader.cpp"
                        ,0x53,"virtual void CFGGrindReader::loadCFGs()");
        }
        pCVar8 = CFGReader::entryNode(pCVar6);
        count_00 = CFG::execs(pCVar6);
        CFG::addEdge(pCVar6,pCVar8,(CfgNode *)data,count_00);
      }
      iVar1 = *(int *)&(this->m_current).data;
      matchToken(this,TKN_NUMBER);
      matchToken(this,TKN_BRACKET_OPEN);
      while ((this->m_current).type != TKN_BRACKET_CLOSE) {
        iVar5 = *(int *)&(this->m_current).data;
        matchToken(this,TKN_NUMBER);
        instr_00 = Instruction::get(AStack_b8,iVar5);
        CfgNode::BlockData::addInstruction(this_00,instr_00);
        AStack_b8 = (long)iVar5 + AStack_b8;
      }
      matchToken(this,TKN_BRACKET_CLOSE);
      iVar5 = CfgNode::BlockData::size(this_00);
      if (iVar1 != iVar5) {
        __assert_fail("bsize == data->size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFGGrindReader.cpp"
                      ,0x68,"virtual void CFGGrindReader::loadCFGs()");
      }
      matchToken(this,TKN_BRACKET_OPEN);
      while ((this->m_current).type != TKN_BRACKET_CLOSE) {
        AVar7 = (this->m_current).data.addr;
        matchToken(this,TKN_ADDR);
        call = (CFG *)0x0;
        if ((this->m_current).type == TKN_COLON) {
          matchToken(this,TKN_COLON);
          call = *(CFG **)&(this->m_current).data;
          matchToken(this,TKN_NUMBER);
        }
        pCVar9 = CFGReader::instance(&this->super_CFGReader,AVar7);
        CfgNode::BlockData::addCall(this_00,pCVar9,(unsigned_long_long)call);
      }
      matchToken(this,TKN_BRACKET_CLOSE);
      matchToken(this,TKN_BRACKET_OPEN);
      while ((this->m_current).type != TKN_BRACKET_CLOSE) {
        iVar1 = *(int *)&(this->m_current).data;
        matchToken(this,TKN_NUMBER);
        matchToken(this,TKN_ARROW);
        AVar7 = (this->m_current).data.addr;
        matchToken(this,TKN_ADDR);
        handler = (CFG *)0x0;
        if ((this->m_current).type == TKN_COLON) {
          matchToken(this,TKN_COLON);
          handler = *(CFG **)&(this->m_current).data;
          matchToken(this,TKN_NUMBER);
        }
        pCVar9 = CFGReader::instance(&this->super_CFGReader,AVar7);
        CfgNode::BlockData::addSignalHandler(this_00,iVar1,pCVar9,(unsigned_long_long)handler);
      }
      matchToken(this,TKN_BRACKET_CLOSE);
      bVar3 = (this->m_current).data.boolean;
      matchToken(this,TKN_BOOL);
      CfgNode::BlockData::setIndirect(this_00,(bool)(bVar3 & 1));
      matchToken(this,TKN_BRACKET_OPEN);
      while ((this->m_current).type != TKN_BRACKET_CLOSE) {
        TVar2 = (this->m_current).type;
        if (TVar2 == TKN_ADDR) {
          AVar7 = (this->m_current).data.addr;
          matchToken(this,TKN_ADDR);
          saddr_1 = (Addr)CFGReader::nodeWithAddr(pCVar6,AVar7);
        }
        else {
          if (TVar2 != TKN_KEYWORD) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFGGrindReader.cpp"
                          ,0xb4,"virtual void CFGGrindReader::loadCFGs()");
          }
          std::__cxx11::string::operator=(local_30,(string *)&(this->m_current).token);
          matchToken(this,TKN_KEYWORD);
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_30,"exit");
          if (bVar3) {
            saddr_1 = (Addr)CFGReader::exitNode(pCVar6);
          }
          else {
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_30,"halt");
            if (!bVar3) {
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFGGrindReader.cpp"
                            ,0xaf,"virtual void CFGGrindReader::loadCFGs()");
            }
            saddr_1 = (Addr)CFGReader::haltNode(pCVar6);
          }
        }
        __range1 = (set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *)0x0;
        if ((this->m_current).type == TKN_COLON) {
          matchToken(this,TKN_COLON);
          __range1 = *(set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> **)
                      &(this->m_current).data;
          matchToken(this,TKN_NUMBER);
        }
        CFG::addEdge(pCVar6,(CfgNode *)data,(CfgNode *)saddr_1,(unsigned_long_long)__range1);
      }
      matchToken(this,TKN_BRACKET_CLOSE);
    }
    matchToken(this,TKN_BRACKET_CLOSE);
    std::__cxx11::string::~string(local_30);
  } while( true );
}

Assistant:

void CFGGrindReader::loadCFGs() {
	while (m_current.type == InputTokenizer::Lexeme::TKN_BRACKET_OPEN) {
		matchToken(InputTokenizer::Lexeme::TKN_BRACKET_OPEN);

		std::string keyword = m_current.token;
		matchToken(InputTokenizer::Lexeme::TKN_KEYWORD);

		if (keyword == "cfg") {
			Addr addr = m_current.data.addr;
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);

			unsigned long long execs = 0;
			if (m_current.type == InputTokenizer::Lexeme::TKN_COLON) {
				matchToken(InputTokenizer::Lexeme::TKN_COLON);

				execs = m_current.data.number;
				matchToken(InputTokenizer::Lexeme::TKN_NUMBER);
			}

			std::string fname = m_current.token;
			matchToken(InputTokenizer::Lexeme::TKN_STRING);

			matchToken(InputTokenizer::Lexeme::TKN_BOOL);

			CFG* cfg = this->instance(addr);
			cfg->setFunctionName(fname);
			cfg->updateExecs(execs);
		} else if (keyword == "node") {
			Addr faddr = m_current.data.addr;
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);

			CFG* cfg = this->instance(faddr);

			Addr baddr = m_current.data.addr;
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);

			CfgNode* node = cfg->nodeByAddr(baddr);
			CfgNode::BlockData* data = new CfgNode::BlockData(baddr);
			if (node == 0) {
				node = new CfgNode(CfgNode::CFG_BLOCK);
				node->setData(data);
				cfg->addNode(node);
			} else {
				assert(node->type() == CfgNode::CFG_PHANTOM);
				node->setData(data);
			}

			if (baddr == cfg->addr()) {
				assert(cfg->entryNode() == 0);
				CfgNode* entry = CFGReader::entryNode(cfg);
				cfg->addEdge(entry, node, cfg->execs());
			}

			int bsize = m_current.data.number;
			matchToken(InputTokenizer::Lexeme::TKN_NUMBER);

			matchToken(InputTokenizer::Lexeme::TKN_BRACKET_OPEN);
			Addr iaddr = baddr;
			while (m_current.type != InputTokenizer::Lexeme::TKN_BRACKET_CLOSE) {
				int size = m_current.data.number;
				matchToken(InputTokenizer::Lexeme::TKN_NUMBER);

				Instruction* instr = Instruction::get(iaddr, size);
				data->addInstruction(instr);

				iaddr += size;
			}
			matchToken(InputTokenizer::Lexeme::TKN_BRACKET_CLOSE);

			assert(bsize == data->size());

			matchToken(InputTokenizer::Lexeme::TKN_BRACKET_OPEN);
			while (m_current.type != InputTokenizer::Lexeme::TKN_BRACKET_CLOSE) {
				Addr caddr = m_current.data.addr;
				matchToken(InputTokenizer::Lexeme::TKN_ADDR);

				unsigned long long count = 0;
				if (m_current.type == InputTokenizer::Lexeme::TKN_COLON) {
					matchToken(InputTokenizer::Lexeme::TKN_COLON);

					count = m_current.data.number;
					matchToken(InputTokenizer::Lexeme::TKN_NUMBER);
				}

				CFG* call = this->instance(caddr);
				data->addCall(call, count);
			}
			matchToken(InputTokenizer::Lexeme::TKN_BRACKET_CLOSE);

			matchToken(InputTokenizer::Lexeme::TKN_BRACKET_OPEN);
			while (m_current.type != InputTokenizer::Lexeme::TKN_BRACKET_CLOSE) {
				int sigid = m_current.data.number;
				matchToken(InputTokenizer::Lexeme::TKN_NUMBER);

				matchToken(InputTokenizer::Lexeme::TKN_ARROW);

				Addr saddr = m_current.data.addr;
				matchToken(InputTokenizer::Lexeme::TKN_ADDR);

				unsigned long long count = 0;
				if (m_current.type == InputTokenizer::Lexeme::TKN_COLON) {
					matchToken(InputTokenizer::Lexeme::TKN_COLON);

					count = m_current.data.number;
					matchToken(InputTokenizer::Lexeme::TKN_NUMBER);
				}

				CFG* handler = this->instance(saddr);
				data->addSignalHandler(sigid, handler, count);
			}
			matchToken(InputTokenizer::Lexeme::TKN_BRACKET_CLOSE);

			bool indirect = m_current.data.boolean;
			matchToken(InputTokenizer::Lexeme::TKN_BOOL);
			data->setIndirect(indirect);

			matchToken(InputTokenizer::Lexeme::TKN_BRACKET_OPEN);
			while (m_current.type != InputTokenizer::Lexeme::TKN_BRACKET_CLOSE) {
				CfgNode* dst = 0;

				switch (m_current.type) {
					case InputTokenizer::Lexeme::TKN_ADDR:
						{
							Addr saddr = m_current.data.addr;
							matchToken(InputTokenizer::Lexeme::TKN_ADDR);

							dst = this->nodeWithAddr(cfg, saddr);
						}

						break;
					case InputTokenizer::Lexeme::TKN_KEYWORD:
						keyword = m_current.token;
						matchToken(InputTokenizer::Lexeme::TKN_KEYWORD);

						if (keyword == "exit")
							dst = CFGReader::exitNode(cfg);
						else if (keyword == "halt")
							dst = CFGReader::haltNode(cfg);
						else {
							// std::cout << keyword << std::endl;
							assert(false);
						}

						break;
					default:
						assert(false);
				}

				unsigned long long count = 0;
				if (m_current.type == InputTokenizer::Lexeme::TKN_COLON) {
					matchToken(InputTokenizer::Lexeme::TKN_COLON);

					count = m_current.data.number;
					matchToken(InputTokenizer::Lexeme::TKN_NUMBER);
				}

				cfg->addEdge(node, dst, count);
			}
			matchToken(InputTokenizer::Lexeme::TKN_BRACKET_CLOSE);
		} else {
			assert(false);
		}

		matchToken(InputTokenizer::Lexeme::TKN_BRACKET_CLOSE);
	}

	matchToken(InputTokenizer::Lexeme::TKN_EOF);

	for (CFG* cfg : this->cfgs())
		cfg->check();
}